

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledOutputFile.cpp
# Opt level: O3

void __thiscall
Imf_2_5::TiledOutputFile::TiledOutputFile
          (TiledOutputFile *this,OStream *os,Header *header,int numThreads)

{
  int iVar1;
  Data *pDVar2;
  OutputStreamMutex *pOVar3;
  undefined4 extraout_var;
  Int64 IVar4;
  stringstream _iex_replace_s;
  
  GenericOutputFile::GenericOutputFile(&this->super_GenericOutputFile);
  (this->super_GenericOutputFile)._vptr_GenericOutputFile =
       (_func_int **)&PTR__TiledOutputFile_003e1ae0;
  pDVar2 = (Data *)operator_new(0x178);
  Data::Data(pDVar2,numThreads);
  this->_data = pDVar2;
  pOVar3 = (OutputStreamMutex *)operator_new(0x38);
  (pOVar3->super_Mutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  pOVar3->os = (OStream *)0x0;
  *(undefined8 *)((long)&(pOVar3->super_Mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (pOVar3->super_Mutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (pOVar3->super_Mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(pOVar3->super_Mutex).super___mutex_base._M_mutex + 8) = 0;
  pOVar3->currentPosition = 0;
  this->_streamData = pOVar3;
  this->_deleteStream = false;
  Header::sanityCheck(header,true,false);
  this->_streamData->os = os;
  this->_data->multipart = false;
  initialize(this,header);
  iVar1 = (*this->_streamData->os->_vptr_OStream[3])();
  pOVar3 = this->_streamData;
  pOVar3->currentPosition = CONCAT44(extraout_var,iVar1);
  GenericOutputFile::writeMagicNumberAndVersionField
            (&this->super_GenericOutputFile,pOVar3->os,&this->_data->header);
  IVar4 = Header::writeTo(&this->_data->header,this->_streamData->os,true);
  pDVar2 = this->_data;
  pDVar2->previewPosition = IVar4;
  IVar4 = TileOffsets::writeTo(&pDVar2->tileOffsets,this->_streamData->os);
  this->_data->tileOffsetsPosition = IVar4;
  return;
}

Assistant:

TiledOutputFile::TiledOutputFile
    (OPENEXR_IMF_INTERNAL_NAMESPACE::OStream &os,
     const Header &header,
     int numThreads)
:
    _data (new Data (numThreads)),
    _streamData (new OutputStreamMutex()),
    _deleteStream (false)
{
    try
    {
        header.sanityCheck(true);
        _streamData->os = &os;
        _data->multipart=false; // since we opened with one header we can't be multipart
        initialize (header);
        _streamData->currentPosition = _streamData->os->tellp();

        // Write header and empty offset table to the file.
        writeMagicNumberAndVersionField(*_streamData->os, _data->header);
        _data->previewPosition = _data->header.writeTo (*_streamData->os, true);
        _data->tileOffsetsPosition = _data->tileOffsets.writeTo (*_streamData->os);
    
    }
    catch (IEX_NAMESPACE::BaseExc &e)
    {
        delete _streamData;
        delete _data;

        REPLACE_EXC (e, "Cannot open image file "
                     "\"" << os.fileName() << "\". " << e.what());
        throw;
    }
    catch (...)
    {
        delete _streamData;
        delete _data;
        throw;
    }
}